

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall CoreML::Specification::ArgMinLayerParams::Clear(ArgMinLayerParams *this)

{
  uint32_t cached_has_bits;
  ArgMinLayerParams *this_local;
  
  memset(&this->axis_,0,9);
  google::protobuf::internal::InternalMetadata::Clear<std::__cxx11::string>
            (&(this->super_MessageLite)._internal_metadata_);
  return;
}

Assistant:

void ArgMinLayerParams::Clear() {
// @@protoc_insertion_point(message_clear_start:CoreML.Specification.ArgMinLayerParams)
  uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  ::memset(&axis_, 0, static_cast<size_t>(
      reinterpret_cast<char*>(&removedim_) -
      reinterpret_cast<char*>(&axis_)) + sizeof(removedim_));
  _internal_metadata_.Clear<std::string>();
}